

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_cascadedUnitsManuallyImportedMissingUnitReferences_Test::TestBody
          (ModelFlattening_cascadedUnitsManuallyImportedMissingUnitReferences_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  byte bVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  unsigned_long local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  AssertionResult gtest_ar_1;
  ComponentPtr component1;
  ModelPtr flatModel;
  ModelPtr model;
  UnitsPtr importedUnits1;
  UnitsPtr thirdUnits;
  ImporterPtr importer;
  UnitsPtr importedUnits2;
  VariablePtr variable;
  ModelPtr importModel1;
  ImportSourcePtr importSource2;
  UnitsPtr secondUnits;
  UnitsPtr firstUnits;
  ModelPtr importModel2;
  ImportSourcePtr importSource1;
  PrinterPtr printer;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"The model is not fully defined.",(allocator<char> *)&gtest_ar);
  libcellml::Importer::create(SUB81(&importer,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"model",(allocator<char> *)&component1);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"importModel1",(allocator<char> *)&component1);
  libcellml::Model::create((string *)&importModel1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"importModel2",(allocator<char> *)&component1);
  libcellml::Model::create((string *)&importModel2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"first_units",(allocator<char> *)&component1);
  libcellml::Units::create((string *)&firstUnits);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = firstUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"second",(allocator<char> *)&secondUnits);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&component1,"",(allocator<char> *)&thirdUnits);
  libcellml::Units::addUnit((string *)peVar1,-1.0,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&component1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"units1_import",(allocator<char> *)&component1);
  libcellml::Units::addUnit
            ((string *)
             firstUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"second_units",(allocator<char> *)&component1);
  libcellml::Units::create((string *)&secondUnits);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = secondUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"second",(allocator<char> *)&thirdUnits);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&component1,"",(allocator<char> *)&variable);
  libcellml::Units::addUnit((string *)peVar1,-2.0,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&component1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"units2_import",(allocator<char> *)&component1);
  libcellml::Units::addUnit
            ((string *)
             secondUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"third_units",(allocator<char> *)&component1);
  libcellml::Units::create((string *)&thirdUnits);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = thirdUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"second",(allocator<char> *)&variable);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&component1,"",(allocator<char> *)&importedUnits1);
  libcellml::Units::addUnit((string *)peVar1,-0.5,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&component1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = thirdUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar5 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"",(allocator<char> *)&component1);
  libcellml::Units::addUnit((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"missing_units",(allocator<char> *)&component1);
  libcellml::Units::addUnit
            ((string *)
             thirdUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"base_component",(allocator<char> *)&variable);
  libcellml::Component::create((string *)&component1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"variable",(allocator<char> *)&importedUnits1);
  libcellml::Variable::create((string *)&variable);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Variable::setUnits
            ((shared_ptr *)
             variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"units1_import",(allocator<char> *)&importedUnits2);
  libcellml::Units::create((string *)&importedUnits1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"units2_import",(allocator<char> *)&printer);
  libcellml::Units::create((string *)&importedUnits2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             importModel1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             importModel1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             importModel2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Printer::create();
  libcellml::ImportSource::create();
  peVar3 = importSource1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"model1.cellml",(allocator<char> *)&importSource2);
  libcellml::ImportSource::setUrl((string *)peVar3);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             importSource1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  libcellml::ImportSource::create();
  peVar3 = importSource2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"model2.cellml",(allocator<char> *)&flatModel);
  libcellml::ImportSource::setUrl((string *)peVar3);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             importSource2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (importedUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"second_units",(allocator<char> *)&flatModel);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (importedUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             + 0x10));
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (importedUnits2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"third_units",(allocator<char> *)&flatModel);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (importedUnits2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             + 0x10));
  std::__cxx11::string::~string((string *)&gtest_ar);
  bVar4 = libcellml::Model::hasUnresolvedImports();
  flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       bVar4 ^ 1;
  flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (bVar4 != 0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,(char *)&flatModel,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x549,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  bVar4 = libcellml::Model::isDefined();
  flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       bVar4 ^ 1;
  flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (bVar4 != 0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,(char *)&flatModel,"model->isDefined()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x54a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  peVar2 = importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"model1.cellml",(allocator<char> *)&flatModel);
  libcellml::Importer::addModel((shared_ptr *)peVar2,(string *)&importModel1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"model2.cellml",(allocator<char> *)&flatModel);
  libcellml::Importer::addModel
            ((shared_ptr *)
             importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&importModel2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Importer::flattenModel((shared_ptr *)&flatModel);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_7_ = 0;
  local_158 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(1)","importer->issueCount()",(unsigned_long *)&gtest_ar_1
             ,&local_158);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x550,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Logger::issue((ulong)&local_158);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"e","importer->issue(0)->description()",&e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x551,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importSource2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importSource1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importedUnits2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importedUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&component1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&thirdUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&secondUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&firstUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importModel2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importModel1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(ModelFlattening, cascadedUnitsManuallyImportedMissingUnitReferences)
{
    const std::string e = "The model is not fully defined.";

    auto importer = libcellml::Importer::create();

    auto model = libcellml::Model::create("model");
    auto importModel1 = libcellml::Model::create("importModel1");
    auto importModel2 = libcellml::Model::create("importModel2");

    auto firstUnits = libcellml::Units::create("first_units");
    firstUnits->addUnit("second", -1.0);
    firstUnits->addUnit("units1_import");

    auto secondUnits = libcellml::Units::create("second_units");
    secondUnits->addUnit("second", -2.0);
    secondUnits->addUnit("units2_import");

    auto thirdUnits = libcellml::Units::create("third_units");
    thirdUnits->addUnit("second", -0.5);
    thirdUnits->addUnit("");
    thirdUnits->addUnit("missing_units");

    auto component1 = libcellml::Component::create("base_component");
    auto variable = libcellml::Variable::create("variable");
    variable->setUnits(firstUnits);
    component1->addVariable(variable);

    model->addUnits(firstUnits);
    model->addComponent(component1);

    auto importedUnits1 = libcellml::Units::create("units1_import");
    auto importedUnits2 = libcellml::Units::create("units2_import");

    model->addUnits(importedUnits1);
    importModel1->addUnits(secondUnits);
    importModel1->addUnits(importedUnits2);
    importModel2->addUnits(thirdUnits);

    auto printer = libcellml::Printer::create();

    auto importSource1 = libcellml::ImportSource::create();
    importSource1->setUrl("model1.cellml");
    importSource1->setModel(importModel1);

    auto importSource2 = libcellml::ImportSource::create();
    importSource2->setUrl("model2.cellml");
    importSource2->setModel(importModel2);

    importedUnits1->setImportSource(importSource1);
    importedUnits1->setImportReference("second_units");

    importedUnits2->setImportSource(importSource2);
    importedUnits2->setImportReference("third_units");

    EXPECT_FALSE(model->hasUnresolvedImports());
    EXPECT_FALSE(model->isDefined());

    importer->addModel(importModel1, "model1.cellml");
    importer->addModel(importModel2, "model2.cellml");

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(e, importer->issue(0)->description());
}